

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unreachable.cc
# Opt level: O0

void __thiscall re2c::Skeleton::warn_unreachable_rules(Skeleton *this)

{
  bool bVar1;
  pointer prVar2;
  mapped_type *pmVar3;
  pointer ppVar4;
  pair<std::_Rb_tree_const_iterator<re2c::rule_rank_t>,_bool> pVar5;
  rule_rank_t local_6c;
  iterator iStack_68;
  rule_rank_t r;
  _Rb_tree_const_iterator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_> local_60;
  iterator local_58;
  _Rb_tree_const_iterator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_> local_50;
  const_iterator i_1;
  rule_rank_t local_34;
  iterator iStack_30;
  rule_rank_t r2;
  _Self local_28;
  const_iterator j;
  set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_> *rs;
  rule_rank_t r1;
  uint32_t i;
  Skeleton *this_local;
  
  _r1 = this;
  Node::calc_reachable(this->nodes);
  rs._4_4_ = 0;
  do {
    if (this->nodes_count <= (ulong)rs._4_4_) {
      local_58._M_node =
           (_Base_ptr)
           std::
           map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
           ::begin(&this->rules);
      std::_Rb_tree_const_iterator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>::
      _Rb_tree_const_iterator(&local_50,&local_58);
      while( true ) {
        iStack_68 = std::
                    map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                    ::end(&this->rules);
        std::_Rb_tree_const_iterator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>::
        _Rb_tree_const_iterator(&local_60,&stack0xffffffffffffff98);
        bVar1 = std::operator!=(&local_50,&local_60);
        if (!bVar1) break;
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>::
                 operator->(&local_50);
        local_6c.value = (ppVar4->first).value;
        bVar1 = rule_rank_t::is_none(&local_6c);
        if (!bVar1) {
          bVar1 = rule_rank_t::is_def(&local_6c);
          if (!bVar1) {
            pmVar3 = std::
                     map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                     ::operator[](&this->rules,&local_6c);
            if ((pmVar3->reachable & 1U) == 0) {
              ppVar4 = std::
                       _Rb_tree_const_iterator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>
                       ::operator->(&local_50);
              Warn::unreachable_rule((Warn *)warn,&this->cond,&ppVar4->second,&this->rules);
            }
          }
        }
        std::_Rb_tree_const_iterator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>::
        operator++(&local_50);
      }
      return;
    }
    rs._0_4_ = this->nodes[rs._4_4_].rule.rank.value;
    j._M_node = (_Base_ptr)&this->nodes[rs._4_4_].reachable;
    local_28._M_node =
         (_Base_ptr)
         std::set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>::begin
                   ((set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_> *)
                    j._M_node);
    while( true ) {
      iStack_30 = std::set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>::
                  end(j._M_node);
      bVar1 = std::operator!=(&local_28,&stack0xffffffffffffffd0);
      if (!bVar1) break;
      prVar2 = std::_Rb_tree_const_iterator<re2c::rule_t>::operator->(&local_28);
      local_34.value = (prVar2->rank).value;
      bVar1 = rule_rank_t::operator==((rule_rank_t *)&rs,&local_34);
      if (bVar1) {
LAB_001c1377:
        pmVar3 = std::
                 map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                 ::operator[](&this->rules,(key_type *)&rs);
        pmVar3->reachable = true;
      }
      else {
        bVar1 = rule_rank_t::is_none(&local_34);
        if (bVar1) goto LAB_001c1377;
        pmVar3 = std::
                 map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                 ::operator[](&this->rules,(key_type *)&rs);
        pVar5 = std::
                set<re2c::rule_rank_t,_std::less<re2c::rule_rank_t>,_std::allocator<re2c::rule_rank_t>_>
                ::insert(&pmVar3->shadow,&local_34);
        i_1._M_node = (_Base_ptr)pVar5.first._M_node;
      }
      std::_Rb_tree_const_iterator<re2c::rule_t>::operator++(&local_28);
    }
    rs._4_4_ = rs._4_4_ + 1;
  } while( true );
}

Assistant:

void Skeleton::warn_unreachable_rules ()
{
	nodes->calc_reachable ();
	for (uint32_t i = 0; i < nodes_count; ++i)
	{
		const rule_rank_t r1 = nodes[i].rule.rank;
		const std::set<rule_t> & rs = nodes[i].reachable;
		for (std::set<rule_t>::const_iterator j = rs.begin (); j != rs.end (); ++j)
		{
			const rule_rank_t r2 = j->rank;
			if (r1 == r2 || r2.is_none ())
			{
				rules[r1].reachable = true;
			}
			else
			{
				rules[r1].shadow.insert (r2);
			}
		}
	}

	// warn about unreachable rules:
	//   - rules that are shadowed by other rules, e.g. rule '[a]' is shadowed by '[a] [^]'
	//   - infinite rules that consume infinitely many characters and fail on YYFILL, e.g. '[^]*'
	//   - rules that contain never-matching link, e.g. '[]' with option '--empty-class match-none'
	// default rule '*' should not be reported
	for (rules_t::const_iterator i = rules.begin (); i != rules.end (); ++i)
	{
		const rule_rank_t r = i->first;
		if (!r.is_none () && !r.is_def () && !rules[r].reachable)
		{
			warn.unreachable_rule (cond, i->second, rules);
		}
	}
}